

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall
CTPNArglistBase::adjust_for_dyn(CTPNArglistBase *this,tcpn_dyncomp_info *info)

{
  CTPNArglistBase *pCVar1;
  
  pCVar1 = this;
  while (pCVar1 = (CTPNArglistBase *)pCVar1->list_, pCVar1 != (CTPNArglistBase *)0x0) {
    (*(((CTPNArgBase *)&pCVar1->super_CTcPrsNode)->super_CTcPrsNode).super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[0x11])(pCVar1,info);
  }
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNArglistBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* adjust each argument list member */
    CTPNArg *arg;
    for (arg = list_ ; arg != 0 ; arg = arg->get_next_arg())
    {
        /* 
         *   adjust this argument; assume the argument node itself isn't
         *   affected 
         */
        arg->adjust_for_dyn(info);
    }

    /* return myself otherwise unchanged */
    return this;
}